

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

Vec_Int_t * Gia_ManGetCiLevels(Gia_Man_t *p)

{
  int iVar1;
  bool bVar2;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vCiLevels;
  Gia_Man_t *p_local;
  
  if (p->vLevels == (Vec_Int_t *)0x0) {
    p_local = (Gia_Man_t *)0x0;
  }
  else {
    iVar1 = Gia_ManCiNum(p);
    p_local = (Gia_Man_t *)Vec_IntAlloc(iVar1);
    local_2c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCis);
      bVar2 = false;
      if (local_2c < iVar1) {
        pGStack_28 = Gia_ManCi(p,local_2c);
        bVar2 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar2) break;
      iVar1 = Gia_ObjLevel(p,pGStack_28);
      Vec_IntPush((Vec_Int_t *)p_local,iVar1);
      local_2c = local_2c + 1;
    }
  }
  return (Vec_Int_t *)p_local;
}

Assistant:

Vec_Int_t * Gia_ManGetCiLevels( Gia_Man_t * p )  
{
    Vec_Int_t * vCiLevels;
    Gia_Obj_t * pObj;
    int i;
    if ( p->vLevels == NULL )
        return NULL;
    vCiLevels = Vec_IntAlloc( Gia_ManCiNum(p) );
    Gia_ManForEachCi( p, pObj, i )
        Vec_IntPush( vCiLevels, Gia_ObjLevel(p, pObj) );
    return vCiLevels;
}